

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

RowSetEntry * rowSetListToTree(RowSetEntry *pList)

{
  long lVar1;
  RowSetEntry *pRVar2;
  RowSetEntry *pRVar3;
  RowSetEntry *in_RDI;
  long in_FS_OFFSET;
  RowSetEntry *pLeft;
  RowSetEntry *p;
  int iDepth;
  undefined8 in_stack_ffffffffffffffd0;
  RowSetEntry *local_20;
  RowSetEntry *local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = in_RDI->pRight;
  in_RDI->pRight = (RowSetEntry *)0x0;
  in_RDI->pLeft = (RowSetEntry *)0x0;
  local_20 = in_RDI;
  while (pRVar3 = local_20, local_10 != (RowSetEntry *)0x0) {
    local_20 = local_10;
    pRVar2 = local_10->pRight;
    local_10->pLeft = pRVar3;
    pRVar3 = rowSetNDeepTree((RowSetEntry **)pRVar3,(int)((ulong)in_stack_ffffffffffffffd0 >> 0x20))
    ;
    local_10->pRight = pRVar3;
    local_10 = pRVar2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_20;
  }
  __stack_chk_fail();
}

Assistant:

static struct RowSetEntry *rowSetListToTree(struct RowSetEntry *pList){
  int iDepth;           /* Depth of the tree so far */
  struct RowSetEntry *p;       /* Current tree root */
  struct RowSetEntry *pLeft;   /* Left subtree */

  assert( pList!=0 );
  p = pList;
  pList = p->pRight;
  p->pLeft = p->pRight = 0;
  for(iDepth=1; pList; iDepth++){
    pLeft = p;
    p = pList;
    pList = p->pRight;
    p->pLeft = pLeft;
    p->pRight = rowSetNDeepTree(&pList, iDepth);
  }
  return p;
}